

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestCase::Run(TestCase *this)

{
  int iVar1;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar2;
  OsStackTraceGetterInterface *pOVar3;
  TimeInMillis TVar4;
  TestInfo *this_03;
  TimeInMillis TVar5;
  int local_3c;
  int i;
  TimeInMillis start;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestCase *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_case(this_00,this);
    this_01 = UnitTest::GetInstance();
    this_02 = UnitTest::listeners(this_01);
    pTVar2 = TestEventListeners::repeater(this_02);
    (*pTVar2->_vptr_TestEventListener[6])(pTVar2,this);
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x1296f0,(char *)0x0)
    ;
    TVar4 = internal::GetTimeInMillis();
    for (local_3c = 0; iVar1 = total_test_count(this), local_3c < iVar1; local_3c = local_3c + 1) {
      this_03 = GetMutableTestInfo(this,local_3c);
      TestInfo::Run(this_03);
    }
    TVar5 = internal::GetTimeInMillis();
    this->elapsed_time_ = TVar5 - TVar4;
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x129710,(char *)0x0)
    ;
    (*pTVar2->_vptr_TestEventListener[10])(pTVar2,this);
    internal::UnitTestImpl::set_current_test_case(this_00,(TestCase *)0x0);
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}